

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

int whisper_decode_with_state
              (whisper_context *ctx,whisper_state *state,whisper_token *tokens,int n_tokens,
              int n_past,int n_threads)

{
  bool bVar1;
  int in_ECX;
  whisper_kv_cache *in_RDX;
  long in_RSI;
  int in_R8D;
  whisper_pos in_R9D;
  ggml_abort_callback in_stack_000000b8;
  bool in_stack_000000c3;
  int in_stack_000000c4;
  whisper_batch *in_stack_000000c8;
  whisper_state *in_stack_000000d0;
  whisper_context *in_stack_000000d8;
  void *in_stack_000000f0;
  uint local_4;
  
  whisper_batch_prep_legacy
            ((whisper_batch *)(in_RSI + 0x180),(whisper_token *)in_RDX,in_ECX,in_R8D,0);
  whisper_kv_cache_seq_rm(in_RDX,in_ECX,in_R8D,in_R9D);
  bVar1 = whisper_decode_internal
                    (in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,
                     in_stack_000000c3,in_stack_000000b8,in_stack_000000f0);
  if (!bVar1) {
    whisper_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to eval\n","whisper_decode_with_state");
  }
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

int whisper_decode_with_state(struct whisper_context * ctx, struct whisper_state * state, const whisper_token * tokens, int n_tokens, int n_past, int n_threads) {
    whisper_batch_prep_legacy(state->batch, tokens, n_tokens, n_past, 0);

    whisper_kv_cache_seq_rm(state->kv_self, 0, n_past, -1);

    if (!whisper_decode_internal(*ctx, *state, state->batch, n_threads, false, nullptr, nullptr)) {
        WHISPER_LOG_ERROR("%s: failed to eval\n", __func__);
        return 1;
    }

    return 0;
}